

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall QMarkdownTextEdit::updateLineNumberArea(QMarkdownTextEdit *this,QRect rect,int dy)

{
  LineNumArea *this_00;
  char cVar1;
  int iVar2;
  QWidget *this_01;
  QRect local_40;
  QRect local_30;
  
  local_40._8_8_ = rect._8_8_;
  local_40._0_8_ = rect._0_8_;
  if (dy == 0) {
    this_00 = this->_lineNumArea;
    iVar2 = LineNumArea::lineNumAreaWidth(this_00);
    QWidget::update(&this_00->super_QWidget,0,rect.y1,iVar2,(rect.y2 - rect.y1) + 1);
  }
  else {
    QWidget::scroll((int)this->_lineNumArea,0);
  }
  updateLineNumAreaGeometry(this);
  this_01 = (QWidget *)QAbstractScrollArea::viewport();
  local_30 = QWidget::rect(this_01);
  iVar2 = (int)&local_30;
  cVar1 = QRect::contains(&local_40,SUB81(&local_30,0));
  if (cVar1 != '\0') {
    updateLineNumberAreaWidth(this,iVar2);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumberArea(const QRect rect, int dy)
{
    if (dy)
        _lineNumArea->scroll(0, dy);
    else
        _lineNumArea->update(0, rect.y(), _lineNumArea->sizeHint().width(), rect.height());

    updateLineNumAreaGeometry();

    if (rect.contains(viewport()->rect())) {
        updateLineNumberAreaWidth(0);
    }
}